

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# write_ahead_log.cpp
# Opt level: O2

void __thiscall duckdb::WriteAheadLog::WriteDropType(WriteAheadLog *this,TypeCatalogEntry *entry)

{
  WriteAheadLogSerializer serializer;
  
  WriteAheadLogSerializer::WriteAheadLogSerializer(&serializer,this,DROP_TYPE);
  Serializer::WriteProperty<std::__cxx11::string>
            (&serializer.serializer.super_Serializer,0x65,"schema",
             &(((entry->super_StandardEntry).schema)->super_InCatalogEntry).super_CatalogEntry.name)
  ;
  Serializer::WriteProperty<std::__cxx11::string>
            (&serializer.serializer.super_Serializer,0x66,"name",
             &(entry->super_StandardEntry).super_InCatalogEntry.super_CatalogEntry.name);
  WriteAheadLogSerializer::End(&serializer);
  WriteAheadLogSerializer::~WriteAheadLogSerializer(&serializer);
  return;
}

Assistant:

void WriteAheadLog::WriteDropType(const TypeCatalogEntry &entry) {
	WriteAheadLogSerializer serializer(*this, WALType::DROP_TYPE);
	serializer.WriteProperty(101, "schema", entry.schema.name);
	serializer.WriteProperty(102, "name", entry.name);
	serializer.End();
}